

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapproc.c
# Opt level: O0

void ffswap2(short *svalues,long nvals)

{
  size_t nvals_00;
  size_t peel;
  long ii;
  long nvals_local;
  short *svalues_local;
  
  if ((long)svalues % 2 == 0) {
    nvals_00 = get_peel(svalues,2,nvals,0x10);
    ffswap2_slow(svalues,nvals_00);
    for (peel = nvals_00; peel < (nvals - nvals_00) - (nvals - nvals_00 & 7); peel = peel + 8) {
      swap2_sse2((char *)(svalues + peel));
    }
    ffswap2_slow(svalues + peel,nvals - peel);
  }
  else {
    ffswap2_slow(svalues,nvals);
  }
  return;
}

Assistant:

void ffswap2(short *svalues,  /* IO - pointer to shorts to be swapped    */
             long nvals)     /* I  - number of shorts to be swapped     */
/*
  swap the bytes in the input short integers: ( 0 1 -> 1 0 )
*/
{
    if ((long)svalues % 2 != 0) { /* should not happen */
        ffswap2_slow(svalues, nvals);
        return;
    }

    long ii;
    size_t peel = get_peel((void*)&svalues[0], sizeof(svalues[0]), nvals, 16);

    ffswap2_slow(svalues, peel);
    for (ii = peel; ii < (nvals - peel - (nvals - peel) % 8); ii+=8) {
        swap2_sse2((char*)&svalues[ii]);
    }
    ffswap2_slow(&svalues[ii], nvals - ii);
}